

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilsTest.hpp
# Opt level: O1

void Qentem::Test::TestCount(QTest *test)

{
  uint *left;
  SizeT length;
  uint local_28 [2];
  
  left = local_28 + 1;
  local_28[0] = 0;
  local_28[1] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,left,local_28,0x4b);
  local_28[0] = 1;
  local_28[1] = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,left,local_28,0x4e);
  local_28[0] = 5;
  local_28[1] = 5;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,left,local_28,0x51);
  local_28[0] = 0;
  local_28[1] = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,left,local_28,0x54);
  local_28[0] = 7;
  local_28[1] = 7;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,left,local_28,0x57);
  local_28[0] = 0xf;
  local_28[1] = 0xf;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,left,local_28,0x5a);
  local_28[0] = 0x1f;
  local_28[1] = 0x1f;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,left,local_28,0x5d);
  local_28[0] = 0x3f;
  local_28[1] = 0x3f;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,left,local_28,0x60);
  return;
}

Assistant:

static void TestCount(QTest &test) {
    SizeT length = StringUtils::Count("");
    test.IsEqual(length, 0U, __LINE__);

    length = StringUtils::Count("a");
    test.IsEqual(length, 1U, __LINE__);

    length = StringUtils::Count("abcde");
    test.IsEqual(length, 5U, __LINE__);

    length = StringUtils::Count("\0");
    test.IsEqual(length, 0U, __LINE__);

    length = StringUtils::Count("1234567");
    test.IsEqual(length, 7U, __LINE__);

    length = StringUtils::Count("123456781234567");
    test.IsEqual(length, 15U, __LINE__);

    length = StringUtils::Count("1234567812345678123456781234567");
    test.IsEqual(length, 31U, __LINE__);

    length = StringUtils::Count("123456781234567812345678123456781234567812345678123456781234567");
    test.IsEqual(length, 63U, __LINE__);
}